

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.h
# Opt level: O2

back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
 utf8::
 utf16to8<__gnu_cxx::__normal_iterator<wchar_t_const*,std::__cxx11::wstring>,std::back_insert_iterator<std::__cxx11::string>>
           (__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
            start,__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                  end,
           back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           result)

{
  wchar_t *pwVar1;
  wchar_t wVar2;
  undefined8 *puVar3;
  uint32_t cp;
  
  do {
    if (start._M_current == end._M_current) {
      return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )result.container;
    }
    pwVar1 = start._M_current + 1;
    wVar2 = *start._M_current;
    cp = wVar2 & 0xffff;
    if ((short)(wVar2 & 0xfc00U) == -0x2800) {
      if (pwVar1 == end._M_current) goto LAB_001e4610;
      wVar2 = *pwVar1;
      if ((wVar2 & 0xfc00U) != 0xdc00) {
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar3 = &PTR__exception_002ab8c0;
        *(short *)(puVar3 + 1) = (short)wVar2;
        goto LAB_001e4647;
      }
      start._M_current = start._M_current + 2;
      cp = cp * 0x400 + (wVar2 & 0xdfffU) + 0xfca02400;
    }
    else {
      start._M_current = pwVar1;
      if ((wVar2 & 0xfc00U) == 0xdc00) {
LAB_001e4610:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar3 = &PTR__exception_002ab8c0;
        *(short *)(puVar3 + 1) = (short)wVar2;
LAB_001e4647:
        __cxa_throw(puVar3,&invalid_utf16::typeinfo,std::exception::~exception);
      }
    }
    result = append<std::back_insert_iterator<std::__cxx11::string>>(cp,result);
  } while( true );
}

Assistant:

octet_iterator utf16to8(u16bit_iterator start, u16bit_iterator end, octet_iterator result)
    {
    while (start != end) {
      uint32_t cp = utf8::internal::mask16(*start++);
      // Take care of surrogate pairs first
      if (utf8::internal::is_lead_surrogate(cp)) {
        if (start != end) {
          uint32_t trail_surrogate = utf8::internal::mask16(*start++);
          if (utf8::internal::is_trail_surrogate(trail_surrogate))
            cp = (cp << 10) + trail_surrogate + internal::SURROGATE_OFFSET;
          else
            throw invalid_utf16(static_cast<uint16_t>(trail_surrogate));
          }
        else
          throw invalid_utf16(static_cast<uint16_t>(cp));

        }
      // Lone trail surrogate
      else if (utf8::internal::is_trail_surrogate(cp))
        throw invalid_utf16(static_cast<uint16_t>(cp));

      result = utf8::append(cp, result);
      }
    return result;
    }